

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::CopyAttConfig::endCopyAttachmentsFrom(CopyAttConfig *this)

{
  ulong uVar1;
  element_type *peVar2;
  allocator<char> local_31;
  string local_30;
  CopyAttConfig *local_10;
  CopyAttConfig *this_local;
  
  local_10 = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"copy attachments: no file specified",&local_31);
    usage(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->config->o);
  std::__cxx11::list<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>::
  push_back(&peVar2->attachments_to_copy,&this->caf);
  return this->config;
}

Assistant:

QPDFJob::Config*
QPDFJob::CopyAttConfig::endCopyAttachmentsFrom()
{
    if (this->caf.path.empty()) {
        usage("copy attachments: no file specified");
    }
    this->config->o.m->attachments_to_copy.push_back(this->caf);
    return this->config;
}